

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcFaceBasedSurfaceModel::~IfcFaceBasedSurfaceModel
          (IfcFaceBasedSurfaceModel *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  void *pvVar3;
  
  p_Var2 = (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                   _vptr_ObjectHelper + (long)p_Var2);
  *(undefined ***)
   ((long)&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper + (long)p_Var2) = &PTR__IfcFaceBasedSurfaceModel_00896e40;
  *(undefined ***)(&this->field_0x48 + (long)p_Var2) = &PTR__IfcFaceBasedSurfaceModel_00896eb8;
  *(undefined ***)
   (&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 +
   (long)p_Var2) = &PTR__IfcFaceBasedSurfaceModel_00896e68;
  *(undefined ***)
   (&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 +
   (long)p_Var2) = &PTR__IfcFaceBasedSurfaceModel_00896e90;
  pvVar3 = *(void **)(&(this->super_IfcGeometricRepresentationItem).field_0x30 + (long)p_Var2);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)(p_Var1 + 0x40) - (long)pvVar3);
  }
  operator_delete(p_Var1,0x60);
  return;
}

Assistant:

IfcFaceBasedSurfaceModel() : Object("IfcFaceBasedSurfaceModel") {}